

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int find_jump_target(JSFunctionDef *s,int label,int *pop,int *pline)

{
  byte bVar1;
  LabelSlot *pLVar2;
  uint8_t *puVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  
  pLVar2 = s->label_slots;
  pLVar2[label].ref_count = pLVar2[label].ref_count + -1;
  puVar3 = (s->byte_code).buf;
  iVar6 = 0;
LAB_00150f23:
  uVar5 = 0x6b;
  if (iVar6 != 10) {
    iVar4 = pLVar2[label].pos2;
    do {
      bVar1 = puVar3[iVar4];
      if (bVar1 != 0xb4) {
        if (bVar1 != 0xc0) goto LAB_00150f62;
        if (pline != (int *)0x0) {
          *pline = *(int *)(puVar3 + (long)iVar4 + 1);
        }
      }
      iVar4 = iVar4 + (uint)opcode_info[bVar1].size;
    } while( true );
  }
LAB_00150f9d:
  *pop = uVar5;
  pLVar2[label].ref_count = pLVar2[label].ref_count + 1;
  return label;
LAB_00150f62:
  uVar5 = (uint)bVar1;
  if (uVar5 != 0x6b) {
    if (uVar5 == 0xe) {
      puVar3 = puVar3 + iVar4;
      do {
        puVar3 = puVar3 + 1;
      } while (*puVar3 == '\x0e');
      if (*puVar3 == ')') {
        uVar5 = 0x29;
      }
      else {
        uVar5 = 0xe;
      }
    }
    goto LAB_00150f9d;
  }
  label = *(int *)(puVar3 + (long)iVar4 + 1);
  iVar6 = iVar6 + 1;
  goto LAB_00150f23;
}

Assistant:

static int find_jump_target(JSFunctionDef *s, int label, int *pop, int *pline)
{
    int i, pos, op;

    update_label(s, label, -1);
    for (i = 0; i < 10; i++) {
        assert(label >= 0 && label < s->label_count);
        pos = s->label_slots[label].pos2;
        for (;;) {
            switch(op = s->byte_code.buf[pos]) {
            case OP_line_num:
                if (pline)
                    *pline = get_u32(s->byte_code.buf + pos + 1);
                /* fall thru */
            case OP_label:
                pos += opcode_info[op].size;
                continue;
            case OP_goto:
                label = get_u32(s->byte_code.buf + pos + 1);
                break;
            case OP_drop:
                /* ignore drop opcodes if followed by OP_return_undef */
                while (s->byte_code.buf[++pos] == OP_drop)
                    continue;
                if (s->byte_code.buf[pos] == OP_return_undef)
                    op = OP_return_undef;
                /* fall thru */
            default:
                goto done;
            }
            break;
        }
    }
    /* cycle detected, could issue a warning */
 done:
    *pop = op;
    update_label(s, label, +1);
    return label;
}